

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::_populateCalledFunctions(LazyLLVMCallGraph *this,Function *fun)

{
  Function *pFVar1;
  Function *pFVar2;
  Function *pFVar3;
  
  for (pFVar1 = *(Function **)(fun + 0x50); pFVar1 != fun + 0x48;
      pFVar1 = *(Function **)(pFVar1 + 8)) {
    pFVar2 = pFVar1 + -0x18;
    if (pFVar1 == (Function *)0x0) {
      pFVar2 = (Function *)0x0;
    }
    for (pFVar3 = *(Function **)(pFVar2 + 0x30); pFVar3 != pFVar2 + 0x28;
        pFVar3 = *(Function **)(pFVar3 + 8)) {
      if ((pFVar3 != (Function *)0x0) && (pFVar3[-8] == (Function)0x53)) {
        getCalledFunctions(this,(CallInst *)(pFVar3 + -0x18));
      }
    }
  }
  return;
}

Assistant:

void _populateCalledFunctions(const llvm::Function *fun) {
        for (auto &B : *fun) {
            for (auto &I : B) {
                if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                    getCalledFunctions(C);
                }
            }
        }
    }